

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

void co_set_env_list(char **name,size_t cnt)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 *puVar6;
  size_t i_1;
  ulong uVar7;
  size_t i;
  size_t sVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (_ZL11g_co_sysenv_0 == (undefined8 *)0x0) {
    uVar7 = 1;
    puVar4 = (undefined8 *)calloc(1,cnt << 4);
    uVar11 = _ZL11g_co_sysenv_1;
    _ZL11g_co_sysenv_0 = puVar4;
    for (sVar8 = 0; cnt != sVar8; sVar8 = sVar8 + 1) {
      pcVar5 = name[sVar8];
      uVar12 = uVar11;
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        pcVar5 = strdup(pcVar5);
        uVar12 = uVar11 + 1;
        _ZL11g_co_sysenv_1 = uVar12;
        puVar4[uVar11 * 2] = pcVar5;
      }
      uVar11 = uVar12;
    }
    if (1 < uVar11) {
      qsort(puVar4,uVar11,0x10,co_sysenv_comp);
      uVar11 = _ZL11g_co_sysenv_1;
      puVar4 = _ZL11g_co_sysenv_0;
      puVar9 = _ZL11g_co_sysenv_0;
      puVar10 = _ZL11g_co_sysenv_0;
      for (; uVar7 < uVar11; uVar7 = uVar7 + 1) {
        puVar1 = puVar9 + 2;
        iVar3 = strcmp((char *)*puVar10,(char *)*puVar1);
        puVar6 = puVar10;
        if ((iVar3 != 0) && (puVar6 = puVar10 + 2, puVar9 != puVar10)) {
          uVar2 = puVar9[3];
          *puVar6 = *puVar1;
          puVar10[3] = uVar2;
        }
        puVar9 = puVar1;
        puVar10 = puVar6;
      }
      _ZL11g_co_sysenv_1 = ((long)puVar10 - (long)puVar4 >> 4) + 1;
    }
    return;
  }
  return;
}

Assistant:

void co_set_env_list( const char *name[],size_t cnt)
{
	if( g_co_sysenv.data )
	{
		return ;
	}
	g_co_sysenv.data = (stCoSysEnv_t*)calloc( 1,sizeof(stCoSysEnv_t) * cnt  );

	for(size_t i=0;i<cnt;i++)
	{
		if( name[i] && name[i][0] )
		{
			g_co_sysenv.data[ g_co_sysenv.cnt++ ].name = strdup( name[i] );
		}
	}
	if( g_co_sysenv.cnt > 1 )
	{
		qsort( g_co_sysenv.data,g_co_sysenv.cnt,sizeof(stCoSysEnv_t),co_sysenv_comp );
		stCoSysEnv_t *lp = g_co_sysenv.data;
		stCoSysEnv_t *lq = g_co_sysenv.data + 1;
		for(size_t i=1;i<g_co_sysenv.cnt;i++)
		{
			if( strcmp( lp->name,lq->name ) )
			{
				++lp;
				if( lq != lp  )
				{
					*lp = *lq;
				}
			}
			++lq;
		}
		g_co_sysenv.cnt = lp - g_co_sysenv.data + 1;
	}

}